

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

void __thiscall Refal2::CArbitraryInteger::Div(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  pointer in_RDX;
  bool bVar4;
  
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    puVar3 = puVar3 + -1;
    do {
      if (*puVar3 != 0) break;
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
      in_RDX = puVar3 + -1;
      bVar4 = puVar3 != puVar2;
      puVar3 = in_RDX;
    } while (bVar4);
  }
  puVar2 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    puVar3 = puVar3 + -1;
    do {
      if (*puVar3 != 0) break;
      (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
      in_RDX = puVar3 + -1;
      bVar4 = puVar3 != puVar2;
      puVar3 = in_RDX;
    } while (bVar4);
  }
  bVar4 = this->isNegative;
  bVar1 = operand->isNegative;
  div(this,(int)operand,(int)in_RDX);
  this->isNegative = bVar4 != bVar1;
  operand->isNegative = bVar4;
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar2 != puVar3 && (puVar3 = puVar3 + -1, *puVar3 == 0))) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  return;
}

Assistant:

void CArbitraryInteger::Div( CArbitraryInteger& operand )
{
	removeLeadingZeros();
	operand.removeLeadingZeros();
	const bool operandSign = IsNegative();
	const bool resultSign = IsNegative() != operand.IsNegative();
	div( operand );
	SetSign( resultSign );
	operand.SetSign( operandSign );
	removeLeadingZeros();
}